

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util_tests.cpp
# Opt level: O1

void __thiscall
iu_AssertionTest_x_iutest_x_MATCHES_REGEXNE_Test::Body
          (iu_AssertionTest_x_iutest_x_MATCHES_REGEXNE_Test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char **in_R9;
  AssertionResult iutest_ar;
  char test [10];
  allocator<char> local_211;
  AssertionResult local_210;
  AssertionHelper local_1e8;
  char local_1b8 [16];
  undefined1 local_1a8 [392];
  
  builtin_strncpy(local_1b8,"te0123sta",10);
  local_1a8._0_8_ = "te[0-9]*st";
  local_1e8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p = local_1b8;
  iuutil::MatchesRegexNeHelper::Assertion<char_const*,char_const*>
            (&local_210,(MatchesRegexNeHelper *)"\"te[0-9]*st\"","test",local_1a8,
             (char **)&local_1e8,in_R9);
  if (local_210.m_result == false) {
    memset((iu_global_format_stringstream *)local_1a8,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_1a8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1e8,local_210.m_message._M_dataplus._M_p,&local_211);
    local_1e8.m_part_result.super_iuCodeMessage.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/util_tests.cpp";
    local_1e8.m_part_result.super_iuCodeMessage.m_line = 0x176;
    local_1e8.m_part_result.super_iuCodeMessage._44_4_ = 2;
    iutest::AssertionHelper::OnFixed(&local_1e8,(Fixed *)local_1a8,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p !=
        &local_1e8.m_part_result.super_iuCodeMessage.m_message.field_2) {
      operator_delete(local_1e8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                      local_1e8.m_part_result.super_iuCodeMessage.m_message.field_2.
                      _M_allocated_capacity + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1a8);
    std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x80));
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_210.m_message._M_dataplus._M_p == &local_210.m_message.field_2) {
      return;
    }
  }
  else {
    paVar1 = &local_210.m_message.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_210.m_message._M_dataplus._M_p != paVar1) {
      operator_delete(local_210.m_message._M_dataplus._M_p,
                      local_210.m_message.field_2._M_allocated_capacity + 1);
    }
    local_1a8._0_8_ = "te[0-9]*st";
    local_1e8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p = local_1b8;
    iuutil::MatchesRegexNeHelper::Assertion<char_const*,char_const*>
              (&local_210,(MatchesRegexNeHelper *)"\"te[0-9]*st\"","test",local_1a8,
               (char **)&local_1e8,in_R9);
    if (local_210.m_result == false) {
      memset((iu_global_format_stringstream *)local_1a8,0,0x188);
      iutest::iu_global_format_stringstream::iu_global_format_stringstream
                ((iu_global_format_stringstream *)local_1a8);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1e8,local_210.m_message._M_dataplus._M_p,&local_211);
      local_1e8.m_part_result.super_iuCodeMessage.m_file =
           "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/util_tests.cpp"
      ;
      local_1e8.m_part_result.super_iuCodeMessage.m_line = 0x177;
      local_1e8.m_part_result.super_iuCodeMessage._44_4_ = 1;
      iutest::AssertionHelper::OnFixed(&local_1e8,(Fixed *)local_1a8,false);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p !=
          &local_1e8.m_part_result.super_iuCodeMessage.m_message.field_2) {
        operator_delete(local_1e8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                        local_1e8.m_part_result.super_iuCodeMessage.m_message.field_2.
                        _M_allocated_capacity + 1);
      }
      std::__cxx11::stringstream::~stringstream((stringstream *)local_1a8);
      std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x80));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_210.m_message._M_dataplus._M_p != paVar1) {
      operator_delete(local_210.m_message._M_dataplus._M_p,
                      local_210.m_message.field_2._M_allocated_capacity + 1);
    }
    local_1a8._0_8_ = "te[0-9]*st";
    local_1e8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p = local_1b8;
    iuutil::MatchesRegexNeHelper::Assertion<char_const*,char_const*>
              (&local_210,(MatchesRegexNeHelper *)"\"te[0-9]*st\"","test",local_1a8,
               (char **)&local_1e8,in_R9);
    if (local_210.m_result == false) {
      memset((iu_global_format_stringstream *)local_1a8,0,0x188);
      iutest::iu_global_format_stringstream::iu_global_format_stringstream
                ((iu_global_format_stringstream *)local_1a8);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1e8,local_210.m_message._M_dataplus._M_p,&local_211);
      local_1e8.m_part_result.super_iuCodeMessage.m_file =
           "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/util_tests.cpp"
      ;
      local_1e8.m_part_result.super_iuCodeMessage.m_line = 0x178;
      local_1e8.m_part_result.super_iuCodeMessage._44_4_ = 0xffffffff;
      iutest::AssertionHelper::OnFixed(&local_1e8,(Fixed *)local_1a8,false);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p !=
          &local_1e8.m_part_result.super_iuCodeMessage.m_message.field_2) {
        operator_delete(local_1e8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                        local_1e8.m_part_result.super_iuCodeMessage.m_message.field_2.
                        _M_allocated_capacity + 1);
      }
      std::__cxx11::stringstream::~stringstream((stringstream *)local_1a8);
      std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x80));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_210.m_message._M_dataplus._M_p != paVar1) {
      operator_delete(local_210.m_message._M_dataplus._M_p,
                      local_210.m_message.field_2._M_allocated_capacity + 1);
    }
    local_1a8._0_8_ = "te[0-9]*st";
    local_1e8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p = local_1b8;
    iuutil::MatchesRegexNeHelper::Assertion<char_const*,char_const*>
              (&local_210,(MatchesRegexNeHelper *)"\"te[0-9]*st\"","test",local_1a8,
               (char **)&local_1e8,in_R9);
    if (local_210.m_result == false) {
      memset((iu_global_format_stringstream *)local_1a8,0,0x188);
      iutest::iu_global_format_stringstream::iu_global_format_stringstream
                ((iu_global_format_stringstream *)local_1a8);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1e8,local_210.m_message._M_dataplus._M_p,&local_211);
      local_1e8.m_part_result.super_iuCodeMessage.m_file =
           "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/util_tests.cpp"
      ;
      local_1e8.m_part_result.super_iuCodeMessage.m_line = 0x179;
      local_1e8.m_part_result.super_iuCodeMessage._44_4_ = 0xfffffffd;
      iutest::AssertionHelper::OnFixed(&local_1e8,(Fixed *)local_1a8,false);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p !=
          &local_1e8.m_part_result.super_iuCodeMessage.m_message.field_2) {
        operator_delete(local_1e8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                        local_1e8.m_part_result.super_iuCodeMessage.m_message.field_2.
                        _M_allocated_capacity + 1);
      }
      std::__cxx11::stringstream::~stringstream((stringstream *)local_1a8);
      std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x80));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_210.m_message._M_dataplus._M_p == paVar1) {
      return;
    }
  }
  operator_delete(local_210.m_message._M_dataplus._M_p,
                  local_210.m_message.field_2._M_allocated_capacity + 1);
  return;
}

Assistant:

IUTEST(AssertionTest, MATCHES_REGEXNE)
{
    const char test[] = "te0123sta";
    IUTEST_ASSERT_MATCHES_REGEXNE("te[0-9]*st", test);
    IUTEST_EXPECT_MATCHES_REGEXNE("te[0-9]*st", test);
    IUTEST_INFORM_MATCHES_REGEXNE("te[0-9]*st", test);
    IUTEST_ASSUME_MATCHES_REGEXNE("te[0-9]*st", test);
}